

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void drawImage6(Array2D<GZ> *px,int w,int h)

{
  GZ *pGVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ushort uVar6;
  unsigned_short uVar7;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int i;
  int iVar13;
  int j;
  int iVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  double a;
  ulong local_a0;
  ulong uVar8;
  
  if (0 < h) {
    local_a0 = 0;
    do {
      if (0 < w) {
        uVar11 = 0;
        do {
          lVar12 = px->_sizeY * local_a0;
          pGVar1 = px->_data;
          pGVar1[lVar12 + uVar11].g._h = 0;
          pGVar1[lVar12 + uVar11].z = 0.0;
          uVar8 = 0;
          dVar3 = 0.0;
          iVar13 = 0;
          do {
            dVar2 = 0.0;
            iVar14 = 0;
            do {
              dVar16 = 0.0;
              dVar4 = 0.0;
              uVar9 = 0;
              do {
                uVar10 = uVar9 + 1;
                if (0xfe < uVar9) break;
                dVar5 = dVar4 * dVar4 - dVar16 * dVar16;
                dVar16 = (dVar4 + dVar4) * dVar16 +
                         (dVar2 * 0.3333333432674408 + (double)(int)local_a0) *
                         ((((double)h * 3.5) / (double)w + -1.3333 + 1.3333) / (double)h) + -1.3333;
                dVar4 = (dVar3 * 0.3333333432674408 + (double)(int)uVar11) * (3.5 / (double)w) +
                        -2.5 + dVar5;
                uVar9 = uVar10;
              } while (dVar5 < 100.0);
              fVar17 = (float)(int)uVar10 * 0.00390625 * 5.0;
              fVar15 = (fVar17 - (float)(int)fVar17) + (fVar17 - (float)(int)fVar17);
              fVar15 = (float)(~-(uint)(fVar15 < 1.0) & (uint)(2.0 - fVar15) |
                              (uint)fVar15 & -(uint)(fVar15 < 1.0)) * 4.0 +
                       half::_toFloat[uVar8 & 0xffff].f;
              if ((fVar15 != 0.0) || (NAN(fVar15))) {
                if (half::_eLut[(uint)fVar15 >> 0x17] == 0) {
                  uVar6 = half::convert((int)fVar15);
                  uVar8 = (ulong)uVar6;
                }
                else {
                  uVar8 = (ulong)((uint)half::_eLut[(uint)fVar15 >> 0x17] +
                                 (((uint)fVar15 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd));
                }
              }
              else {
                uVar8 = (ulong)((uint)fVar15 >> 0x10);
              }
              pGVar1[lVar12 + uVar11].g._h = (unsigned_short)uVar8;
              pGVar1[lVar12 + uVar11].z = fVar17;
              dVar2 = dVar2 + 1.0;
              iVar14 = iVar14 + 1;
            } while (iVar14 != 3);
            dVar3 = dVar3 + 1.0;
            iVar13 = iVar13 + 1;
          } while (iVar13 != 3);
          fVar15 = half::_toFloat[uVar8 & 0xffff].f * 0.11111112;
          if ((fVar15 != 0.0) || (NAN(fVar15))) {
            if (half::_eLut[(uint)fVar15 >> 0x17] == 0) {
              uVar7 = half::convert((int)fVar15);
              fVar17 = pGVar1[lVar12 + uVar11].z;
            }
            else {
              uVar7 = half::_eLut[(uint)fVar15 >> 0x17] +
                      (short)(((uint)fVar15 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          else {
            uVar7 = (unsigned_short)((uint)fVar15 >> 0x10);
          }
          pGVar1[lVar12 + uVar11].g._h = uVar7;
          pGVar1[lVar12 + uVar11].z = fVar17 * 0.11111112;
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)w);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 != (uint)h);
  }
  return;
}

Assistant:

void
drawImage6 (Array2D<GZ> &px, int w, int h)
{
    mndl (px,
	  w, h,
	  0, w,
	  0, h,
	  3, 3,
	  -2.5, 1.0,
	  -1.3333,
	  1,
	  0, 0);
}